

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::ServiceOptions::Swap(ServiceOptions *this,ServiceOptions *other)

{
  uint32 uVar1;
  int iVar2;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  
  if (other != this) {
    internal::RepeatedPtrFieldBase::Swap
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
               &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar3 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar3;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
    return;
  }
  return;
}

Assistant:

void ServiceOptions::Swap(ServiceOptions* other) {
  if (other != this) {
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}